

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

void __thiscall
polyscope::render::ManagedBuffer<double>::markRenderAttributeBufferUpdated
          (ManagedBuffer<double> *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  pointer pdVar2;
  
  checkDeviceBufferTypeIs(this,Attribute);
  this->hostBufferIsPopulated = false;
  pvVar1 = this->data;
  pdVar2 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar2) {
    (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar2;
  }
  updateIndexedViews(this);
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::markRenderAttributeBufferUpdated() {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  invalidateHostBuffer();
  updateIndexedViews();
  requestRedraw();
}